

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::IndexedStateQueryTests::init
          (IndexedStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  long *plVar4;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  long *plVar6;
  long lVar7;
  long *local_90;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test SAMPLE_MASK_VALUE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fb68;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0xffffffff;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test MAX_COMPUTE_WORK_GROUP_COUNT");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fbb8;
    pTVar3[1].m_testCtx = (TestContext *)0xffff000091be;
    pTVar3[1].m_name._M_dataplus._M_p = (pointer)0xffff0000ffff;
    *(undefined4 *)&pTVar3[1].m_name._M_string_length = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test MAX_COMPUTE_WORK_GROUP_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fbb8;
    pTVar3[1].m_testCtx = (TestContext *)0x80000091bf;
    pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x4000000080;
    *(undefined4 *)&pTVar3[1].m_name._M_string_length = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test ATOMIC_COUNTER_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fc08;
    pTVar3[1].m_testCtx = (TestContext *)0x92c0000092c1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x92dc;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test ATOMIC_COUNTER_BUFFER_START");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fc58;
    pTVar3[1].m_testCtx = (TestContext *)0x92c0000092c2;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x92dc;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test ATOMIC_COUNTER_BUFFER_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fca8;
    pTVar3[1].m_testCtx = (TestContext *)0x92c0000092c3;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x92dc;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test SHADER_STORAGE_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fc08;
    pTVar3[1].m_testCtx = (TestContext *)0x90d2000090d3;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x90dd;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test SHADER_STORAGE_BUFFER_START");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fc58;
    pTVar3[1].m_testCtx = (TestContext *)0x90d2000090d4;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x90dd;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "Test SHADER_STORAGE_BUFFER_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fca8;
    pTVar3[1].m_testCtx = (TestContext *)0x90d2000090d5;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x90dd;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_NAME");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fcf8;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_LEVEL");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fd48;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_LAYERED");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fd98;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_LAYER");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fde8;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_ACCESS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fe38;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"Test IMAGE_BINDING_FORMAT");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fe88;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = &local_80;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"BLEND");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4fed8;
  *(undefined4 *)&pTVar3[1].m_testCtx = 8;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::vec4Verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"COLOR_WRITEMASK")
    ;
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4ff28;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,"BLEND_SRC and BLEND_DST");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4ff78;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "BLEND_EQUATION_RGB and BLEND_DST");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b4ffc8;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::verifiers + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_90,
               "BLEND_EQUATION_RGB and BLEND_DST");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b50018;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    puVar5 = &local_40;
    if (local_50 != puVar5) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      puVar5 = extraout_RAX;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  return (int)puVar5;
}

Assistant:

void IndexedStateQueryTests::init (void)
{
	static const QueryType verifiers[] = { QUERY_INDEXED_BOOLEAN, QUERY_INDEXED_INTEGER, QUERY_INDEXED_INTEGER64 };
	static const QueryType vec4Verifiers[] = { QUERY_INDEXED_BOOLEAN_VEC4, QUERY_INDEXED_INTEGER_VEC4, QUERY_INDEXED_INTEGER64_VEC4 };

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const QueryType verifier = verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);							\
		this->addChild(X);																	\
	}

#define FOR_EACH_VEC4_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(vec4Verifiers); ++verifierNdx)	\
	{																							\
		const QueryType verifier = vec4Verifiers[verifierNdx];									\
		const char* verifierSuffix = getVerifierSuffix(verifier);								\
		this->addChild(X);																		\
	}

	FOR_EACH_VERIFIER(new SampleMaskCase			(m_context, (std::string() + "sample_mask_value_" + verifierSuffix).c_str(),				"Test SAMPLE_MASK_VALUE", verifier))

	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_count_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_COUNT",	GL_MAX_COMPUTE_WORK_GROUP_COUNT,	tcu::IVec3(65535,65535,65535),	verifier))
	FOR_EACH_VERIFIER(new MinValueIndexed3Case		(m_context, (std::string() + "max_compute_work_group_size_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_SIZE",		GL_MAX_COMPUTE_WORK_GROUP_SIZE,		tcu::IVec3(128, 128, 64),		verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "atomic_counter_buffer_binding_" + verifierSuffix).c_str(),	"Test ATOMIC_COUNTER_BUFFER_BINDING",	GL_ATOMIC_COUNTER_BUFFER_BINDING,	GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "atomic_counter_buffer_start_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_START",		GL_ATOMIC_COUNTER_BUFFER_START,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "atomic_counter_buffer_size_" + verifierSuffix).c_str(),		"Test ATOMIC_COUNTER_BUFFER_SIZE",		GL_ATOMIC_COUNTER_BUFFER_SIZE,		GL_ATOMIC_COUNTER_BUFFER,	GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase			(m_context, (std::string() + "shader_storage_buffer_binding_" + verifierSuffix).c_str(),	"Test SHADER_STORAGE_BUFFER_BINDING",	GL_SHADER_STORAGE_BUFFER_BINDING,	GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferStartCase			(m_context, (std::string() + "shader_storage_buffer_start_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_START",		GL_SHADER_STORAGE_BUFFER_START,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))
	FOR_EACH_VERIFIER(new BufferSizeCase			(m_context, (std::string() + "shader_storage_buffer_size_" + verifierSuffix).c_str(),		"Test SHADER_STORAGE_BUFFER_SIZE",		GL_SHADER_STORAGE_BUFFER_SIZE,		GL_SHADER_STORAGE_BUFFER,	GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,	verifier))

	FOR_EACH_VERIFIER(new ImageBindingNameCase		(m_context, (std::string() + "image_binding_name_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_NAME",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLevelCase		(m_context, (std::string() + "image_binding_level_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LEVEL",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayeredCase	(m_context, (std::string() + "image_binding_layered_" + verifierSuffix).c_str(),			"Test IMAGE_BINDING_LAYERED",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingLayerCase		(m_context, (std::string() + "image_binding_layer_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_LAYER",				verifier))
	FOR_EACH_VERIFIER(new ImageBindingAccessCase	(m_context, (std::string() + "image_binding_access_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_ACCESS",			verifier))
	FOR_EACH_VERIFIER(new ImageBindingFormatCase	(m_context, (std::string() + "image_binding_format_" + verifierSuffix).c_str(),				"Test IMAGE_BINDING_FORMAT",			verifier))

	{
		const QueryType verifier = QUERY_INDEXED_ISENABLED;
		const char* verifierSuffix = getVerifierSuffix(verifier);
		this->addChild(new EnableBlendCase			(m_context, (std::string() + "blend_" + verifierSuffix).c_str(),							"BLEND",								verifier));
	}
	FOR_EACH_VEC4_VERIFIER(new ColorMaskCase		(m_context, (std::string() + "color_mask_" + verifierSuffix).c_str(),						"COLOR_WRITEMASK",						verifier))
	FOR_EACH_VERIFIER(new BlendFuncCase				(m_context, (std::string() + "blend_func_" + verifierSuffix).c_str(),						"BLEND_SRC and BLEND_DST",				verifier))
	FOR_EACH_VERIFIER(new BlendEquationCase			(m_context, (std::string() + "blend_equation_" + verifierSuffix).c_str(),					"BLEND_EQUATION_RGB and BLEND_DST",		verifier))
	FOR_EACH_VERIFIER(new BlendEquationAdvancedCase	(m_context, (std::string() + "blend_equation_advanced_" + verifierSuffix).c_str(),			"BLEND_EQUATION_RGB and BLEND_DST",		verifier))

#undef FOR_EACH_VEC4_VERIFIER
#undef FOR_EACH_VERIFIER
}